

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITab::draw(CGUITab *this)

{
  long *plVar1;
  long in_RDI;
  IGUISkin *skin;
  
  if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
    plVar1 = (long *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x60))();
    if ((plVar1 != (long *)0x0) && ((*(byte *)(in_RDI + 0x140) & 1) != 0)) {
      (**(code **)(*plVar1 + 0xa8))(plVar1,in_RDI,in_RDI + 0x134,in_RDI + 0x40,in_RDI + 0x50);
    }
    IGUIElement::draw((IGUIElement *)this);
  }
  return;
}

Assistant:

void CGUITab::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	if (skin && DrawBackground)
		skin->draw2DRectangle(this, BackColor, AbsoluteRect, &AbsoluteClippingRect);

	IGUIElement::draw();
}